

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wavelet.cpp
# Opt level: O1

void idx2::BuildSubbands(v3i *N3,int NLevels,u64 TransformOrder,array<idx2::subband> *Subbands)

{
  byte *pbVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  char cVar14;
  short sVar15;
  byte bVar16;
  ulong uVar17;
  grid *pgVar18;
  byte *pbVar19;
  long lVar20;
  grid *pgVar21;
  byte *pbVar22;
  char *__function;
  long lVar23;
  uint uVar24;
  dimension dVar25;
  char cVar26;
  ulong uVar27;
  u64 uVar28;
  short sVar29;
  ulong uVar30;
  u64 uVar31;
  i8 iVar32;
  bool bVar33;
  v3<signed_char> NextLevel3;
  v3<signed_char> MaxLevel3;
  v3<signed_char> NextLowHigh3;
  grid_split Gs;
  circular_queue<idx2::subband,_256> Queue;
  u64 auStack_4f38 [360];
  anon_union_2_4_6ba14846_for_v2<signed_char>_1 local_43f2;
  char local_43f0;
  char local_43ef [3];
  anon_union_2_4_6ba14846_for_v2<signed_char>_1 local_43ec;
  char local_43ea;
  int local_43e8;
  dimension local_43e4;
  ulong local_43e0;
  subband local_43d8;
  array<idx2::subband> *local_4390;
  u64 local_4388;
  u64 local_4380;
  grid_split local_4378;
  subband local_4348 [12];
  undefined1 local_4040 [48];
  anon_union_2_4_6ba14846_for_v2<signed_char>_1 aStack_4010;
  char acStack_400e [4];
  anon_union_2_4_6ba14846_for_v2<signed_char>_1 aStack_400a;
  char acStack_4008 [16336];
  undefined4 local_38;
  
  Subbands->Size = 0;
  local_43e8 = NLevels;
  GrowCapacity<idx2::subband>
            (Subbands,(long)(((NLevels <<
                              (1 < (N3->field_0).field_0.Z) +
                              (1 < (N3->field_0).field_0.Y) + (1 < (N3->field_0).field_0.X)) -
                             NLevels) + 1));
  lVar23 = 0;
  do {
    acStack_400e[lVar23 + 7] = '\0';
    *(undefined1 (*) [32])(local_4040 + lVar23) = ZEXT1632(ZEXT816(0) << 0x40);
    *(undefined1 (*) [32])(local_4040 + lVar23 + 0x10) = ZEXT1632(ZEXT816(0) << 0x40);
    lVar23 = lVar23 + 0x40;
  } while (lVar23 != 0x4000);
  acStack_4008[0x3fc8] = '\0';
  local_38 = 0;
  local_4348[0].Grid.super_extent.From = 0;
  local_4348[0].Grid.super_extent.Dims =
       (ulong)((N3->field_0).field_0.Z & 0x1fffff) << 0x2a |
       ((ulong)(uint)(N3->field_0).field_0.Y & 0x1fffff) << 0x15 |
       (ulong)(uint)(N3->field_0).field_0.X & 0x1fffff;
  local_4348[0].Grid.Strd = 0x40000200001;
  local_4348[0].AccumGrid.super_extent.From = 0;
  local_4348[0].AccumGrid.Strd = 0x40000200001;
  local_4348[0]._48_8_ = 0;
  local_4348[0]._56_2_ = 0;
  local_4348[0].AccumGrid.super_extent.Dims = local_4348[0].Grid.super_extent.Dims;
  PushBack<idx2::subband,256>((circular_queue<idx2::subband,_256> *)local_4040,local_4348);
  local_43ef[0] = '\0';
  local_43ef[1] = '\0';
  local_43ef[2] = '\0';
  memset(local_4348,0,0x301);
  uVar27 = 0;
  if (0 < local_43e8) {
    uVar27 = 0;
    local_4390 = Subbands;
    uVar31 = TransformOrder;
    do {
      local_43e4 = (dimension)TransformOrder & (Z|Y);
      uVar28 = TransformOrder >> 2;
      if (local_43e4 == (Z|Y)) {
        sVar29 = (local_38._2_2_ - (short)local_38) + 0x100;
        if ((short)local_38 <= local_38._2_2_) {
          sVar29 = local_38._2_2_ - (short)local_38;
        }
        if (uVar28 != 3) {
          uVar31 = uVar28;
        }
        if (0 < (short)(sVar29 - 1U)) {
          uVar30 = (ulong)(ushort)(sVar29 - 1U);
          do {
            uVar24 = local_38 + (int)uVar30;
            if (Subbands->Capacity <= Subbands->Size) {
              GrowCapacity<idx2::subband>(Subbands,0);
            }
            uVar17 = (ulong)((uVar24 & 0xff) << 6);
            pbVar22 = (Subbands->Buffer).Data;
            lVar23 = Subbands->Size;
            Subbands->Size = lVar23 + 1;
            lVar23 = lVar23 * 0x40;
            uVar2 = *(undefined8 *)(local_4040 + uVar17);
            uVar3 = *(undefined8 *)(local_4040 + uVar17 + 8);
            uVar4 = *(undefined8 *)(local_4040 + uVar17 + 0x10);
            uVar5 = *(undefined8 *)(local_4040 + uVar17 + 0x18);
            uVar6 = *(undefined8 *)(local_4040 + uVar17 + 0x22);
            uVar7 = *(undefined8 *)(local_4040 + uVar17 + 0x2a);
            uVar8 = *(undefined8 *)(acStack_400e + uVar17);
            pbVar1 = pbVar22 + lVar23 + 0x1a;
            *(undefined8 *)pbVar1 = *(undefined8 *)(local_4040 + uVar17 + 0x1a);
            *(undefined8 *)(pbVar1 + 8) = uVar6;
            *(undefined8 *)(pbVar1 + 0x10) = uVar7;
            *(undefined8 *)(pbVar1 + 0x18) = uVar8;
            pbVar1 = pbVar22 + lVar23;
            *(undefined8 *)pbVar1 = uVar2;
            *(undefined8 *)(pbVar1 + 8) = uVar3;
            *(undefined8 *)(pbVar1 + 0x10) = uVar4;
            *(undefined8 *)(pbVar1 + 0x18) = uVar5;
            PopBack<idx2::subband,256>
                      (&local_43d8,(idx2 *)local_4040,(circular_queue<idx2::subband,_256> *)0x1,
                       (i16)pbVar22);
            bVar33 = 1 < (long)uVar30;
            uVar30 = uVar30 - 1;
          } while (bVar33);
        }
        cVar26 = (char)uVar27 + '\x01';
        if ('\x1f' < cVar26) goto LAB_001a465d;
        (&local_4348[0].Grid)[cVar26].Strd =
             *(u64 *)(local_4040 + (ulong)(byte)local_38 * 0x40 + 0x10);
        (&local_4348[0].Grid)[cVar26].super_extent =
             *(extent *)(local_4040 + (ulong)(byte)local_38 * 0x40);
        uVar27 = CONCAT71((int7)(uVar27 >> 8),cVar26);
        TransformOrder = uVar31;
      }
      else {
        sVar29 = (local_38._2_2_ - (short)local_38) + 0x100;
        if ((short)local_38 <= local_38._2_2_) {
          sVar29 = local_38._2_2_ - (short)local_38;
        }
        dVar25 = (dimension)TransformOrder & (Z|Y);
        local_43ef[dVar25] = local_43ef[dVar25] + '\x01';
        TransformOrder = uVar28;
        if (0 < sVar29) {
          do {
            local_4380 = uVar31;
            local_4388 = uVar28;
            local_43e0 = uVar27;
            SplitAlternate(&local_4378,(grid *)(local_4040 + (ulong)(byte)local_38 * 0x40),
                           local_43e4);
            lVar23 = (ulong)(byte)local_38 * 0x40;
            local_43f2 = *(anon_union_2_4_6ba14846_for_v2<signed_char>_1 *)
                          (acStack_400e + lVar23 + -2);
            local_43f0 = acStack_400e[lVar23];
            local_43f2.E[dVar25] = local_43f2.E[dVar25] + '\x01';
            local_43ea = acStack_400e[lVar23 + 6];
            local_43ec = *(anon_union_2_4_6ba14846_for_v2<signed_char>_1 *)
                          (acStack_400e + lVar23 + 4);
            local_43ec.E[dVar25] = '\x01';
            local_43d8.Grid.Strd = local_4378.First.Strd;
            local_43d8.Grid.super_extent.From = local_4378.First.super_extent.From;
            local_43d8.Grid.super_extent.Dims = local_4378.First.super_extent.Dims;
            local_43d8.AccumGrid.Strd._0_2_ = (undefined2)local_4378.First.Strd;
            local_43d8.AccumGrid.Strd._2_6_ = (undefined6)(local_4378.First.Strd >> 0x10);
            local_43d8.AccumGrid.super_extent.From._0_2_ =
                 (undefined2)local_4378.First.super_extent.From;
            local_43d8.AccumGrid.super_extent.From._2_6_ =
                 (undefined6)(local_4378.First.super_extent.From >> 0x10);
            local_43d8.AccumGrid.super_extent.Dims._0_2_ =
                 (undefined2)local_4378.First.super_extent.Dims;
            local_43d8.AccumGrid.super_extent.Dims._2_6_ =
                 (undefined6)(local_4378.First.super_extent.Dims >> 0x10);
            local_43d8.Level3.field_0.field_0.Z = local_43f0;
            local_43d8.Level3.field_0.field_3.XY.field_0 =
                 (v2<signed_char>)(v2<signed_char>)local_43f2;
            local_43d8.Level3Rev.field_0.field_0.Z = local_43f0;
            local_43d8.Level3Rev.field_0.field_3.XY.field_0 =
                 (v2<signed_char>)(v2<signed_char>)local_43f2;
            local_43d8.LowHigh3.field_0.field_3.XY.field_0 =
                 (v2<signed_char>)
                 (v2<signed_char>)
                 *(anon_union_2_4_6ba14846_for_v2<signed_char>_1 *)(acStack_400e + lVar23 + 4);
            local_43d8.LowHigh3.field_0.field_0.Z = acStack_400e[lVar23 + 6];
            iVar32 = (i8)local_43e0;
            local_43d8.Level = iVar32;
            PushBack<idx2::subband,256>
                      ((circular_queue<idx2::subband,_256> *)local_4040,&local_43d8);
            local_43d8.Grid.Strd = local_4378.Second.Strd;
            local_43d8.Grid.super_extent.From = local_4378.Second.super_extent.From;
            local_43d8.Grid.super_extent.Dims = local_4378.Second.super_extent.Dims;
            local_43d8.AccumGrid.Strd._0_2_ = (undefined2)local_4378.Second.Strd;
            local_43d8.AccumGrid.Strd._2_6_ = (undefined6)(local_4378.Second.Strd >> 0x10);
            local_43d8.AccumGrid.super_extent.From._0_2_ =
                 (undefined2)local_4378.Second.super_extent.From;
            local_43d8.AccumGrid.super_extent.From._2_6_ =
                 (undefined6)(local_4378.Second.super_extent.From >> 0x10);
            local_43d8.AccumGrid.super_extent.Dims._0_2_ =
                 (undefined2)local_4378.Second.super_extent.Dims;
            local_43d8.AccumGrid.super_extent.Dims._2_6_ =
                 (undefined6)(local_4378.Second.super_extent.Dims >> 0x10);
            lVar23 = (ulong)(byte)local_38 * 0x40;
            local_43d8.Level3.field_0.field_0.Z = acStack_400e[lVar23];
            local_43d8.Level3.field_0.field_3.XY.field_0 =
                 (v2<signed_char>)
                 (v2<signed_char>)
                 *(anon_union_2_4_6ba14846_for_v2<signed_char>_1 *)(acStack_400e + lVar23 + -2);
            local_43d8.Level3Rev.field_0.field_3.XY.field_0 =
                 (v2<signed_char>)
                 (v2<signed_char>)
                 *(anon_union_2_4_6ba14846_for_v2<signed_char>_1 *)(acStack_400e + lVar23 + -2);
            local_43d8.Level3Rev.field_0.field_0.Z = acStack_400e[lVar23];
            local_43d8.LowHigh3.field_0.field_3.XY.field_0 =
                 (v2<signed_char>)(v2<signed_char>)local_43ec;
            local_43d8.LowHigh3.field_0.field_0.Z = local_43ea;
            local_43d8.Level = iVar32;
            PushBack<idx2::subband,256>
                      ((circular_queue<idx2::subband,_256> *)local_4040,&local_43d8);
            sVar15 = (short)local_38;
            local_38 = CONCAT22(local_38._2_2_,(ushort)(byte)((char)local_38 + 1));
            if (0xff < sVar15) {
              __function = 
              "t &idx2::stack_array<idx2::subband, 256>::operator[](int) const [t = idx2::subband, N = 256]"
              ;
              goto LAB_001a4650;
            }
            sVar29 = sVar29 + -1;
            Subbands = local_4390;
            uVar27 = local_43e0;
            TransformOrder = local_4388;
            uVar31 = local_4380;
            uVar28 = local_4388;
          } while (sVar29 != 0);
        }
      }
    } while ((char)uVar27 < local_43e8);
  }
  sVar29 = (local_38._2_2_ - (short)local_38) + 0x100;
  if ((short)local_38 <= local_38._2_2_) {
    sVar29 = local_38._2_2_ - (short)local_38;
  }
  if (0 < sVar29) {
    lVar23 = (ulong)(byte)local_38 * 0x40;
    if (Subbands->Capacity <= Subbands->Size) {
      GrowCapacity<idx2::subband>(Subbands,0);
    }
    pbVar1 = (Subbands->Buffer).Data;
    lVar20 = Subbands->Size;
    Subbands->Size = lVar20 + 1;
    lVar20 = lVar20 * 0x40;
    uVar2 = *(undefined8 *)(local_4040 + lVar23);
    uVar3 = *(undefined8 *)(local_4040 + lVar23 + 8);
    uVar4 = *(undefined8 *)(local_4040 + lVar23 + 0x10);
    uVar5 = *(undefined8 *)(local_4040 + lVar23 + 0x18);
    uVar6 = *(undefined8 *)(local_4040 + lVar23 + 0x22);
    uVar7 = *(undefined8 *)(local_4040 + lVar23 + 0x2a);
    uVar8 = *(undefined8 *)(acStack_400e + lVar23);
    pbVar22 = pbVar1 + lVar20 + 0x1a;
    *(undefined8 *)pbVar22 = *(undefined8 *)(local_4040 + lVar23 + 0x1a);
    *(undefined8 *)(pbVar22 + 8) = uVar6;
    *(undefined8 *)(pbVar22 + 0x10) = uVar7;
    *(undefined8 *)(pbVar22 + 0x18) = uVar8;
    pbVar1 = pbVar1 + lVar20;
    *(undefined8 *)pbVar1 = uVar2;
    *(undefined8 *)(pbVar1 + 8) = uVar3;
    *(undefined8 *)(pbVar1 + 0x10) = uVar4;
    *(undefined8 *)(pbVar1 + 0x18) = uVar5;
  }
  cVar26 = local_43ef[2];
  if ('\0' < (char)uVar27) {
    pgVar18 = &local_4348[0].Grid + (uVar27 & 0xff);
    pgVar21 = &local_4348[0].AccumGrid;
    do {
      local_43d8.Grid.Strd = (((subband *)(pgVar21 + -1))->Grid).Strd;
      local_43d8.Grid.super_extent.From = (((subband *)(pgVar21 + -1))->Grid).super_extent.From;
      local_43d8.Grid.super_extent.Dims = (((subband *)(pgVar21 + -1))->Grid).super_extent.Dims;
      (((subband *)(pgVar21 + -1))->Grid).Strd = pgVar18->Strd;
      uVar31 = (pgVar18->super_extent).Dims;
      (((subband *)(pgVar21 + -1))->Grid).super_extent.From = (pgVar18->super_extent).From;
      (((subband *)(pgVar21 + -1))->Grid).super_extent.Dims = uVar31;
      pgVar18->Strd = local_43d8.Grid.Strd;
      (pgVar18->super_extent).From = local_43d8.Grid.super_extent.From;
      (pgVar18->super_extent).Dims = local_43d8.Grid.super_extent.Dims;
      pgVar18 = pgVar18 + -1;
      bVar33 = pgVar21 < pgVar18;
      pgVar21 = pgVar21 + 1;
    } while (bVar33);
  }
  lVar23 = Subbands->Size;
  if (0 < lVar23) {
    local_43e4 = CONCAT31(local_43e4._1_3_,local_43ef[0]);
    cVar14 = local_43ef[1];
    lVar20 = 0;
    do {
      pbVar1 = (Subbands->Buffer).Data;
      pbVar1[lVar20 + 0x32] = cVar26 - pbVar1[lVar20 + 0x35];
      *(ushort *)(pbVar1 + lVar20 + 0x30) =
           CONCAT11(cVar14 - pbVar1[lVar20 + 0x34],(undefined1)local_43e4 - pbVar1[lVar20 + 0x33]);
      bVar16 = ~pbVar1[lVar20 + 0x39] + (char)local_43e8;
      pbVar1[lVar20 + 0x39] = bVar16;
      if ('\x1f' < (char)bVar16) {
LAB_001a465d:
        __function = 
        "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]";
LAB_001a4650:
        __assert_fail("Idx < N",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                      ,0x20c,__function);
      }
      MergeSubbandGrids(&local_43d8.Grid,&local_4348[0].Grid + (char)bVar16,
                        (grid *)(pbVar1 + lVar20));
      *(u64 *)(pbVar1 + lVar20 + 0x28) = local_43d8.Grid.Strd;
      *(u64 *)(pbVar1 + lVar20 + 0x18) = local_43d8.Grid.super_extent.From;
      *(u64 *)((long)(pbVar1 + lVar20 + 0x18) + 8) = local_43d8.Grid.super_extent.Dims;
      lVar20 = lVar20 + 0x40;
      lVar23 = lVar23 + -1;
    } while (lVar23 != 0);
  }
  pbVar1 = (Subbands->Buffer).Data;
  pbVar22 = pbVar1 + (Subbands->Size * 8 + -8) * 8;
  if (pbVar1 < pbVar22) {
    do {
      pbVar19 = pbVar1 + 0x40;
      uVar2 = *(undefined8 *)pbVar1;
      uVar3 = *(undefined8 *)(pbVar1 + 8);
      uVar4 = *(undefined8 *)(pbVar1 + 0x10);
      uVar5 = *(undefined8 *)(pbVar1 + 0x18);
      uVar6 = *(undefined8 *)(pbVar1 + 0x30);
      local_43d8.AccumGrid.super_extent.Dims._0_2_ = (undefined2)*(undefined8 *)(pbVar1 + 0x20);
      local_43d8.AccumGrid.super_extent.Dims._2_6_ =
           (undefined6)((ulong)*(undefined8 *)(pbVar1 + 0x20) >> 0x10);
      local_43d8.AccumGrid.Strd._0_2_ = (undefined2)*(undefined8 *)(pbVar1 + 0x28);
      local_43d8.AccumGrid.Strd._2_6_ = (undefined6)((ulong)*(undefined8 *)(pbVar1 + 0x28) >> 0x10);
      local_43d8.Level3.field_0.field_3.XY.field_0 = SUB82(uVar6,0);
      local_43d8.LowHigh3.field_0.field_0.Z = (char)*(undefined8 *)(pbVar1 + 0x38);
      local_43d8.Level = (i8)((ulong)*(undefined8 *)(pbVar1 + 0x38) >> 8);
      local_43d8.AccumGrid.super_extent.From._2_6_ = (undefined6)((ulong)uVar5 >> 0x10);
      uVar7 = *(undefined8 *)pbVar22;
      uVar8 = *(undefined8 *)(pbVar22 + 8);
      uVar9 = *(undefined8 *)(pbVar22 + 0x10);
      uVar10 = *(undefined8 *)(pbVar22 + 0x18);
      uVar11 = *(undefined8 *)(pbVar22 + 0x22);
      uVar12 = *(undefined8 *)(pbVar22 + 0x2a);
      uVar13 = *(undefined8 *)(pbVar22 + 0x32);
      *(undefined8 *)(pbVar1 + 0x1a) = *(undefined8 *)(pbVar22 + 0x1a);
      *(undefined8 *)(pbVar1 + 0x22) = uVar11;
      *(undefined8 *)(pbVar1 + 0x2a) = uVar12;
      *(undefined8 *)(pbVar1 + 0x32) = uVar13;
      *(undefined8 *)pbVar1 = uVar7;
      *(undefined8 *)(pbVar1 + 8) = uVar8;
      *(undefined8 *)(pbVar1 + 0x10) = uVar9;
      *(undefined8 *)(pbVar1 + 0x18) = uVar10;
      *(undefined8 *)pbVar22 = uVar2;
      *(undefined8 *)(pbVar22 + 8) = uVar3;
      *(undefined8 *)(pbVar22 + 0x10) = uVar4;
      *(undefined8 *)(pbVar22 + 0x18) = uVar5;
      *(ulong *)(pbVar22 + 0x1a) =
           CONCAT26((undefined2)local_43d8.AccumGrid.super_extent.Dims,
                    local_43d8.AccumGrid.super_extent.From._2_6_);
      *(ulong *)(pbVar22 + 0x22) =
           CONCAT26((undefined2)local_43d8.AccumGrid.Strd,
                    local_43d8.AccumGrid.super_extent.Dims._2_6_);
      *(ulong *)(pbVar22 + 0x2a) =
           CONCAT26(local_43d8.Level3.field_0.field_3.XY.field_0,local_43d8.AccumGrid.Strd._2_6_);
      *(ulong *)(pbVar22 + 0x32) =
           CONCAT17(local_43d8.Level,
                    CONCAT16(local_43d8.LowHigh3.field_0.field_0.Z,(int6)((ulong)uVar6 >> 0x10)));
      pbVar22 = pbVar22 + -0x40;
      pbVar1 = pbVar19;
    } while (pbVar19 < pbVar22);
  }
  return;
}

Assistant:

void
BuildSubbands(const v3i& N3, int NLevels, u64 TransformOrder, array<subband>* Subbands)
{
  Clear(Subbands);
  Reserve(Subbands, ((1 << NumDims(N3)) - 1) * NLevels + 1);
  circular_queue<subband, 256> Queue;
  PushBack(&Queue, subband{ grid(N3), grid(N3), v3<i8>(0), v3<i8>(0), v3<i8>(0), i8(0) });
  i8 Level = 0;
  u64 PrevOrder = TransformOrder;
  v3<i8> MaxLevel3(0);
  stack_array<grid, 32> Grids;
  while (Level < NLevels)
  {
    idx2_Assert(TransformOrder != 0);
    int D = TransformOrder & 0x3;
    TransformOrder >>= 2;
    if (D == 3)
    {                          // next level
      if (TransformOrder == 3) // next one is the last +
        TransformOrder = PrevOrder;
      else
        PrevOrder = TransformOrder;
      i16 Sz = Size(Queue);
      for (i16 I = Sz - 1; I >= 1; --I)
      {
        PushBack(Subbands, Queue[I]);
        PopBack(&Queue);
      }
      ++Level;
      Grids[Level] = Queue[0].Grid;
    }
    else
    {
      ++MaxLevel3[D];
      i16 Sz = Size(Queue);
      for (i16 I = 0; I < Sz; ++I)
      {
        const grid& G = Queue[0].Grid;
        grid_split Gs = SplitAlternate(G, dimension(D));
        v3<i8> NextLevel3 = Queue[0].Level3;
        ++NextLevel3[D];
        v3<i8> NextLowHigh3 = Queue[0].LowHigh3;
        idx2_Assert(NextLowHigh3[D] == 0);
        NextLowHigh3[D] = 1;
        PushBack(&Queue,
                 subband{ Gs.First, Gs.First, NextLevel3, NextLevel3, Queue[0].LowHigh3, Level });
        PushBack(
          &Queue,
          subband{ Gs.Second, Gs.Second, Queue[0].Level3, Queue[0].Level3, NextLowHigh3, Level });
        PopFront(&Queue);
      }
    }
  }
  if (Size(Queue) > 0)
    PushBack(Subbands, Queue[0]);
  Reverse(Begin(Grids), Begin(Grids) + Level + 1);
  i64 Sz = Size(*Subbands);
  for (i64 I = 0; I < Sz; ++I)
  {
    subband& Sband = (*Subbands)[I];
    Sband.Level3 = MaxLevel3 - Sband.Level3Rev;
    Sband.Level = i8(NLevels - Sband.Level - 1);
    Sband.AccumGrid = MergeSubbandGrids(Grids[Sband.Level], Sband.Grid);
  }
  Reverse(Begin(*Subbands), End(*Subbands));
}